

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

uint __thiscall EOPlus::Parser::ParseVersion(Parser *this)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Parser_Error *pPVar5;
  pointer pPVar6;
  Token *t_00;
  Token *t_01;
  Token local_298;
  string local_248;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1b9;
  Token local_1b8;
  string local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  anon_class_1_0_00000001 local_d9;
  function<bool_(const_EOPlus::Token_&)> local_d8;
  variant local_a8;
  undefined1 local_68 [8];
  Token t;
  uint version;
  Parser *this_local;
  
  t._76_4_ = 0;
  util::variant::variant(&local_a8);
  Token::Token((Token *)local_68,Invalid,&local_a8);
  util::variant::~variant(&local_a8);
  bVar2 = GetToken(this,(Token *)local_68,4);
  if (!bVar2) {
    pPVar5 = (Parser_Error *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"Expected number after \'version\'",&local_221);
    std::operator+(&local_200,&local_220," Got: ");
    pPVar6 = std::
             unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ::operator->(&this->tok);
    Parser_Token_Server_Base::RejectToken(&local_298,pPVar6);
    token_got_string_abi_cxx11_(&local_248,(EOPlus *)&local_298,t_01);
    std::operator+(&local_1e0,&local_200,&local_248);
    pPVar6 = std::
             unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
             ::operator->(&this->tok);
    iVar4 = Parser_Token_Server_Base::RejectLine(pPVar6);
    Parser_Error::Parser_Error(pPVar5,&local_1e0,iVar4);
    __cxa_throw(pPVar5,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
  }
  iVar4 = util::variant::operator_cast_to_int((variant *)&t);
  t._76_4_ = t._76_4_ + iVar4 * 0x10000;
  std::function<bool(EOPlus::Token_const&)>::function<EOPlus::Parser::ParseVersion()::__0,void>
            ((function<bool(EOPlus::Token_const&)> *)&local_d8,&local_d9);
  bVar2 = GetTokenIf(this,(Token *)local_68,&local_d8,0x40);
  std::function<bool_(const_EOPlus::Token_&)>::~function(&local_d8);
  if (bVar2) {
    bVar2 = GetToken(this,(Token *)local_68,4);
    if (!bVar2) {
      local_1b9 = 1;
      pPVar5 = (Parser_Error *)__cxa_allocate_exception(0x18);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"Expected number after \'.\' in version.",&local_141);
      std::operator+(&local_120,&local_140," Got: ");
      pPVar6 = std::
               unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ::operator->(&this->tok);
      Parser_Token_Server_Base::RejectToken(&local_1b8,pPVar6);
      token_got_string_abi_cxx11_(&local_168,(EOPlus *)&local_1b8,t_00);
      std::operator+(&local_100,&local_120,&local_168);
      pPVar6 = std::
               unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
               ::operator->(&this->tok);
      iVar4 = Parser_Token_Server_Base::RejectLine(pPVar6);
      Parser_Error::Parser_Error(pPVar5,&local_100,iVar4);
      local_1b9 = 0;
      __cxa_throw(pPVar5,&Parser_Error::typeinfo,Parser_Error::~Parser_Error);
    }
    uVar3 = util::variant::operator_cast_to_int((variant *)&t);
    t._76_4_ = uVar3 & 0xffff | t._76_4_;
  }
  uVar1 = t._76_4_;
  Token::~Token((Token *)local_68);
  return uVar1;
}

Assistant:

unsigned int Parser::ParseVersion()
	{
		typedef unsigned int ui;
		unsigned int version = 0;
		Token t;

		if (this->GetToken(t, Token::Integer))
		{
			version += ui(int(t.data)) << 16;

			if (this->GetTokenIf(t, [](const Token& t) { return std::string(t.data) == "."; }, Token::Symbol))
			{
				if (this->GetToken(t, Token::Integer))
					version |= ui(int(t.data)) & 0xFFFF;
				else
					PARSER_ERROR_GOT("Expected number after '.' in version.");
			}
		}
		else
		{
			PARSER_ERROR_GOT("Expected number after 'version'");
		}

		return version;
	}